

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O3

cmGeneratorExpressionDAGChecker * __thiscall
cmGeneratorExpressionDAGChecker::Top(cmGeneratorExpressionDAGChecker *this)

{
  cmGeneratorExpressionDAGChecker *top;
  
  do {
    top = this;
    this = this->Parent;
  } while (this != (cmGeneratorExpressionDAGChecker *)0x0);
  return top;
}

Assistant:

cmGeneratorExpressionDAGChecker const* cmGeneratorExpressionDAGChecker::Top()
  const
{
  const cmGeneratorExpressionDAGChecker* top = this;
  const cmGeneratorExpressionDAGChecker* parent = this->Parent;
  while (parent) {
    top = parent;
    parent = parent->Parent;
  }
  return top;
}